

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

uint __thiscall dg::vr::RelationsAnalyzer::analyze(RelationsAnalyzer *this,uint maxPass)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  long *plVar7;
  Function *function;
  
  lVar1 = *(long *)(this + 0x30);
  uVar3 = 0;
  plVar7 = (long *)(lVar1 + 0x20);
  while (lVar2 = *plVar7, lVar2 != lVar1 + 0x18) {
    function = (Function *)(lVar2 + -0x38);
    if (lVar2 == 0) {
      function = (Function *)0x0;
    }
    cVar4 = llvm::GlobalValue::isDeclaration();
    if (cVar4 == '\0') {
      bVar5 = true;
      for (uVar6 = 0; (bVar5 != false && (uVar6 < maxPass)); uVar6 = uVar6 + 1) {
        bVar5 = passFunction(this,function,false);
      }
      if (uVar3 <= uVar6) {
        uVar3 = uVar6;
      }
    }
    plVar7 = (long *)(lVar2 + 8);
  }
  return uVar3;
}

Assistant:

unsigned RelationsAnalyzer::analyze(unsigned maxPass) {
    unsigned maxExecutedPass = 0;

    for (const auto &function : module) {
        if (function.isDeclaration())
            continue;

        bool changed = true;
        unsigned passNum = 0;
        while (changed && passNum < maxPass) {
            changed = passFunction(function, false); // passNum + 1 == maxPass);
            ++passNum;
        }

        maxExecutedPass = std::max(maxExecutedPass, passNum);
    }

    return maxExecutedPass;
}